

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyHashingShardedKVS.hpp
# Opt level: O3

void __thiscall
supermap::KeyHashingShardedKVS<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>::
add(KeyHashingShardedKVS<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *this,
   Key<128UL> *key,ByteArray<4096UL> *value)

{
  Hasher *hasher;
  pointer puVar1;
  __uniq_ptr_impl<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>
  _Var2;
  uint64_t uVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  byte bVar7;
  array<unsigned_char,_128UL> in_stack_fffffffffffffed8;
  undefined8 local_a8 [16];
  
  bVar7 = 0;
  hasher = (this->hasher_)._M_t.
           super___uniq_ptr_impl<supermap::Hasher,_std::default_delete<supermap::Hasher>_>._M_t.
           super__Tuple_impl<0UL,_supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>.
           super__Head_base<0UL,_supermap::Hasher_*,_false>._M_head_impl;
  memcpy(local_a8,key,0x80);
  puVar5 = local_a8;
  puVar6 = (undefined8 *)&stack0xfffffffffffffed8;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
  }
  uVar3 = hashTools::hashWith<supermap::Key<128ul>>
                    (hasher,(Key<128UL>)in_stack_fffffffffffffed8._M_elems,0xef);
  puVar1 = (this->nestedStorages_).
           super__Vector_base<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_t.
  super__Tuple_impl<0UL,_supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_*,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>
  .
  super__Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_*,_false>
  ._M_head_impl =
       puVar1[uVar3 % (ulong)((long)(this->nestedStorages_).
                                    super__Vector_base<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)]
       ._M_t.
       super___uniq_ptr_impl<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>
       ._M_t;
  (*(code *)**(undefined8 **)
              _Var2._M_t.
              super__Tuple_impl<0UL,_supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_*,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>
              .
              super__Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_*,_false>
              ._M_head_impl)
            (_Var2._M_t.
             super__Tuple_impl<0UL,_supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_*,_std::default_delete<supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_>_>
             .
             super__Head_base<0UL,_supermap::KeyValueStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>_*,_false>
             ._M_head_impl,key,value);
  return;
}

Assistant:

void add(const Key &key, Value &&value) override {
        nestedStorages_[getShardIdForKey(key)]->add(key, std::move(value));
    }